

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testConversion.cpp
# Opt level: O0

void (anonymous_namespace)::
     testScanLineImageChannel<unsigned_int,(Imf_3_4::PixelType)0,float,(Imf_3_4::PixelType)2>
               (char *fileName,int width,int height,Compression compression)

{
  int iVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  ostream *poVar5;
  uint *puVar6;
  int *piVar7;
  char *pcVar8;
  float *pfVar9;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  char *in_RDI;
  int x_1;
  int y_1;
  InputFile in;
  FrameBuffer fb_1;
  Array2D<float> inPixels;
  OutputFile out;
  FrameBuffer fb;
  Header hdr;
  int x;
  int y;
  Array2D<unsigned_int> outPixels;
  Compression in_stack_fffffffffffffdac;
  undefined4 in_stack_fffffffffffffdb0;
  undefined4 uVar10;
  float t2;
  float in_stack_fffffffffffffdb4;
  undefined4 in_stack_fffffffffffffdb8;
  undefined4 uVar11;
  undefined4 in_stack_fffffffffffffdbc;
  undefined4 in_stack_fffffffffffffdc0;
  undefined4 in_stack_fffffffffffffdc4;
  int local_1b8;
  int local_1b4;
  undefined1 local_1b0 [88];
  char local_158 [48];
  Array2D<float> local_128;
  undefined1 local_110 [72];
  char local_c8 [52];
  Channel local_94 [28];
  Vec2<float> local_78;
  Header local_70 [56];
  int local_38;
  int local_34;
  Array2D<unsigned_int> local_30;
  int local_14;
  int local_10;
  int local_c;
  char *local_8;
  
  local_14 = in_ECX;
  local_10 = in_EDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  poVar5 = std::operator<<((ostream *)&std::cout,"scan lines, compression ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_14);
  poVar5 = std::operator<<(poVar5,", ");
  poVar5 = std::operator<<(poVar5,"output type ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,0);
  poVar5 = std::operator<<(poVar5,", ");
  poVar5 = std::operator<<(poVar5,"input type ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,2);
  poVar5 = std::operator<<(poVar5,":\n    ");
  std::ostream::operator<<(poVar5,std::flush<char,std::char_traits<char>>);
  Imf_3_4::Array2D<unsigned_int>::Array2D
            ((Array2D<unsigned_int> *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
             CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8),
             CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0));
  for (local_34 = 0; iVar1 = local_c, iVar4 = local_10, local_34 < local_10; local_34 = local_34 + 1
      ) {
    for (local_38 = 0; local_38 < local_c; local_38 = local_38 + 1) {
      uVar3 = local_38 * 10 + local_34;
      puVar6 = Imf_3_4::Array2D<unsigned_int>::operator[](&local_30,(long)local_34);
      puVar6[local_38] = uVar3;
    }
  }
  Imath_3_2::Vec2<float>::Vec2(&local_78,0.0,0.0);
  Imf_3_4::Header::Header
            (local_70,iVar1,iVar4,1.0,(Vec2 *)&local_78,1.0,INCREASING_Y,ZIP_COMPRESSION);
  piVar7 = (int *)Imf_3_4::Header::compression();
  *piVar7 = local_14;
  pcVar8 = (char *)Imf_3_4::Header::channels();
  Imf_3_4::Channel::Channel(local_94,UINT,1,1,false);
  Imf_3_4::ChannelList::insert(pcVar8,(Channel *)0x22e4ae);
  Imf_3_4::FrameBuffer::FrameBuffer((FrameBuffer *)0x16746e);
  puVar6 = Imf_3_4::Array2D<unsigned_int>::operator[](&local_30,0);
  uVar11 = 0;
  uVar10 = 0;
  Imf_3_4::Slice::Slice
            ((Slice *)(local_110 + 0x10),UINT,(char *)puVar6,4,(long)local_c << 2,1,1,0.0,false,
             false);
  Imf_3_4::FrameBuffer::insert(local_c8,(Slice *)0x22e4ae);
  poVar5 = std::operator<<((ostream *)&std::cout,"writing ");
  std::ostream::operator<<(poVar5,std::flush<char,std::char_traits<char>>);
  pcVar8 = local_8;
  iVar4 = Imf_3_4::globalThreadCount();
  Imf_3_4::OutputFile::OutputFile((OutputFile *)local_110,pcVar8,local_70,iVar4);
  Imf_3_4::OutputFile::setFrameBuffer((FrameBuffer *)local_110);
  Imf_3_4::OutputFile::writePixels((int)local_110);
  Imf_3_4::OutputFile::~OutputFile((OutputFile *)local_110);
  Imf_3_4::FrameBuffer::~FrameBuffer((FrameBuffer *)0x167594);
  Imf_3_4::Header::~Header(local_70);
  Imf_3_4::Array2D<float>::Array2D
            ((Array2D<float> *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
             CONCAT44(in_stack_fffffffffffffdbc,uVar11),CONCAT44(in_stack_fffffffffffffdb4,uVar10));
  poVar5 = std::operator<<((ostream *)&std::cout,"reading ");
  std::ostream::operator<<(poVar5,std::flush<char,std::char_traits<char>>);
  Imf_3_4::FrameBuffer::FrameBuffer((FrameBuffer *)0x1675fa);
  pfVar9 = Imf_3_4::Array2D<float>::operator[](&local_128,0);
  t2 = 0.0;
  Imf_3_4::Slice::Slice
            ((Slice *)(local_1b0 + 0x20),FLOAT,(char *)pfVar9,4,(long)local_c << 2,1,1,0.0,false,
             false);
  Imf_3_4::FrameBuffer::insert(local_158,(Slice *)0x22e4ae);
  pcVar8 = local_8;
  iVar4 = Imf_3_4::globalThreadCount();
  Imf_3_4::InputFile::InputFile((InputFile *)local_1b0,pcVar8,iVar4);
  Imf_3_4::InputFile::setFrameBuffer((FrameBuffer *)local_1b0);
  Imf_3_4::InputFile::readPixels((int)local_1b0,0);
  Imf_3_4::InputFile::~InputFile((InputFile *)CONCAT44(in_stack_fffffffffffffdb4,t2));
  Imf_3_4::FrameBuffer::~FrameBuffer((FrameBuffer *)0x1676f5);
  poVar5 = std::operator<<((ostream *)&std::cout,"comparing");
  std::ostream::operator<<(poVar5,std::flush<char,std::char_traits<char>>);
  local_1b4 = 0;
  do {
    if (local_10 <= local_1b4) {
      std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
      remove(local_8);
      Imf_3_4::Array2D<float>::~Array2D((Array2D<float> *)CONCAT44(in_stack_fffffffffffffdb4,t2));
      Imf_3_4::Array2D<unsigned_int>::~Array2D
                ((Array2D<unsigned_int> *)CONCAT44(in_stack_fffffffffffffdb4,t2));
      return;
    }
    for (local_1b8 = 0; local_1b8 < local_c; local_1b8 = local_1b8 + 1) {
      Imf_3_4::Array2D<float>::operator[](&local_128,(long)local_1b4);
      Imf_3_4::Array2D<unsigned_int>::operator[](&local_30,(long)local_1b4);
      bVar2 = anon_unknown.dwarf_7fa20::isEquivalent<float>
                        (in_stack_fffffffffffffdb4,t2,in_stack_fffffffffffffdac);
      if (!bVar2) {
        __assert_fail("isEquivalent ( inPixels[y][x], InType (outPixels[y][x]), compression)",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testConversion.cpp"
                      ,0xd4,
                      "void (anonymous namespace)::testScanLineImageChannel(const char *, int, int, Compression) [OutType = unsigned int, OutTypeTag = Imf_3_4::UINT, InType = float, InTypeTag = Imf_3_4::FLOAT]"
                     );
      }
    }
    local_1b4 = local_1b4 + 1;
  } while( true );
}

Assistant:

void
testScanLineImageChannel (
    const char fileName[], int width, int height, Compression compression)
{
    cout << "scan lines, "
            "compression "
         << compression << ", "
         << "output type " << OutTypeTag << ", "
         << "input type " << InTypeTag << ":\n    " << flush;

    Array2D<OutType> outPixels (height, width);

    for (int y = 0; y < height; ++y)
        for (int x = 0; x < width; ++x)
            outPixels[y][x] = x * 10 + y;

    {
        Header hdr (width, height);

        hdr.compression () = compression;

        hdr.channels ().insert (
            "X",                   // name
            Channel (OutTypeTag)); // type

        FrameBuffer fb;

        fb.insert (
            "X", // name
            Slice (
                OutTypeTag,                         // type
                (char*) &outPixels[0][0],           // base
                sizeof (outPixels[0][0]),           // xStride
                sizeof (outPixels[0][0]) * width)); // yStride

        cout << "writing " << flush;

        OutputFile out (fileName, hdr);
        out.setFrameBuffer (fb);
        out.writePixels (height);
    }

    Array2D<InType> inPixels (height, width);

    {
        cout << "reading " << flush;

        FrameBuffer fb;

        fb.insert (
            "X", // name
            Slice (
                InTypeTag,                         // type
                (char*) &inPixels[0][0],           // base
                sizeof (inPixels[0][0]),           // xStride
                sizeof (inPixels[0][0]) * width)); // yStride

        InputFile in (fileName);
        in.setFrameBuffer (fb);
        in.readPixels (0, height - 1);
    }

    cout << "comparing" << flush;

    for (int y = 0; y < height; ++y)
    {
        for (int x = 0; x < width; ++x)
        {
            assert (isEquivalent (
                inPixels[y][x], InType (outPixels[y][x]), compression));
        }
    }

    cout << endl;

    remove (fileName);
}